

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O0

h__Reader * __thiscall
AS_02::PCM::MXFReader::h__Reader::ReadFrame
          (h__Reader *this,ui32_t FrameNum,FrameBuffer *FrameBuf,AESDecContext *param_3,
          HMACContext *param_4)

{
  long *plVar1;
  int iVar2;
  ui32_t uVar3;
  ui32_t uVar4;
  ui32_t uVar5;
  ulong uVar6;
  int64_t iVar7;
  byte_t *pbVar8;
  undefined4 in_register_00000034;
  long lVar9;
  ulong local_170;
  Result_t local_140 [108];
  ui32_t local_d4;
  ulong uStack_d0;
  ui32_t read_size;
  ui64_t remainder;
  undefined1 local_49;
  long local_48;
  ui64_t position;
  ui64_t offset;
  HMACContext *param_4_local;
  AESDecContext *param_3_local;
  FrameBuffer *FrameBuf_local;
  long lStack_18;
  ui32_t FrameNum_local;
  h__Reader *this_local;
  Result_t *result;
  
  lVar9 = CONCAT44(in_register_00000034,FrameNum);
  FrameBuf_local._4_4_ = (uint)FrameBuf;
  param_4_local = param_4;
  param_3_local = param_3;
  lStack_18 = lVar9;
  this_local = this;
  uVar6 = (**(code **)(**(long **)(lVar9 + 0x10) + 0x40))();
  if ((uVar6 & 1) == 0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  }
  else if (FrameBuf_local._4_4_ < *(uint *)(lVar9 + 0x510)) {
    if (*(long *)(lVar9 + 0x500) == 0) {
      __assert_fail("m_ClipEssenceBegin",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_PCM.cpp"
                    ,0xa6,
                    "ASDCP::Result_t AS_02::PCM::MXFReader::h__Reader::ReadFrame(ui32_t, ASDCP::PCM::FrameBuffer &, ASDCP::AESDecContext *, ASDCP::HMACContext *)"
                   );
    }
    position = (ulong)FrameBuf_local._4_4_ * (ulong)*(uint *)(lVar9 + 0x514);
    local_48 = *(long *)(lVar9 + 0x500) + position;
    local_49 = 0;
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    iVar7 = Kumu::IFileReader::TellPosition(*(IFileReader **)(lVar9 + 0x10));
    if (iVar7 != local_48) {
      (**(code **)(**(long **)(lVar9 + 0x10) + 0x28))(&remainder,*(long **)(lVar9 + 0x10),local_48);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&remainder);
      Kumu::Result_t::~Result_t((Result_t *)&remainder);
    }
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      uStack_d0 = *(long *)(lVar9 + 0x508) - position;
      local_170 = uStack_d0;
      if (*(uint *)(lVar9 + 0x514) <= uStack_d0) {
        local_170 = (ulong)*(uint *)(lVar9 + 0x514);
      }
      local_d4 = (ui32_t)local_170;
      plVar1 = *(long **)(lVar9 + 0x10);
      pbVar8 = ASDCP::FrameBuffer::Data((FrameBuffer *)param_3_local);
      (**(code **)(*plVar1 + 0x38))(local_140,plVar1,pbVar8,local_d4,0);
      Kumu::Result_t::operator=((Result_t *)this,local_140);
      Kumu::Result_t::~Result_t(local_140);
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (-1 < iVar2) {
        ASDCP::FrameBuffer::Size((FrameBuffer *)param_3_local,local_d4);
        uVar4 = local_d4;
        uVar3 = ASDCP::FrameBuffer::Capacity((FrameBuffer *)param_3_local);
        if (uVar4 < uVar3) {
          pbVar8 = ASDCP::FrameBuffer::Data((FrameBuffer *)param_3_local);
          uVar4 = ASDCP::FrameBuffer::Size((FrameBuffer *)param_3_local);
          uVar3 = ASDCP::FrameBuffer::Capacity((FrameBuffer *)param_3_local);
          uVar5 = ASDCP::FrameBuffer::Size((FrameBuffer *)param_3_local);
          memset(pbVar8 + uVar4,0,(ulong)(uVar3 - uVar5));
        }
      }
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_RANGE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFReader::h__Reader::ReadFrame(ui32_t FrameNum, ASDCP::PCM::FrameBuffer& FrameBuf,
					    ASDCP::AESDecContext*, ASDCP::HMACContext*)
{
  if ( ! m_File->IsOpen() )
    {
      return RESULT_INIT;
    }

  if ( ! ( FrameNum < m_ClipDurationFrames ) )
    {
      return RESULT_RANGE;
    }

  assert(m_ClipEssenceBegin);
  ui64_t offset = static_cast<ui64_t>(FrameNum) * static_cast<ui64_t>(m_BytesPerFrame);
  ui64_t position = m_ClipEssenceBegin + offset;
  Result_t result = RESULT_OK;

  if ( m_File->TellPosition() != static_cast<Kumu::fpos_t>(position) )
    {
      result = m_File->Seek(position);
    }

  if ( KM_SUCCESS(result) )
    {
      ui64_t remainder = m_ClipSize - offset;
      ui32_t read_size = ( remainder < m_BytesPerFrame ) ? remainder : m_BytesPerFrame;
      result = m_File->Read(FrameBuf.Data(), read_size);

      if ( KM_SUCCESS(result) )
	{
	  FrameBuf.Size(read_size);

	  if ( read_size < FrameBuf.Capacity() )
	    {
	      memset(FrameBuf.Data() + FrameBuf.Size(), 0, FrameBuf.Capacity() - FrameBuf.Size());
	    }
	}
    }

  return result;
}